

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakWarningTest_LeakWarningWithPluginDisabled_TestShell::
~TEST_MemoryLeakWarningTest_LeakWarningWithPluginDisabled_TestShell
          (TEST_MemoryLeakWarningTest_LeakWarningWithPluginDisabled_TestShell *this)

{
  TEST_MemoryLeakWarningTest_LeakWarningWithPluginDisabled_TestShell *this_local;
  
  ~TEST_MemoryLeakWarningTest_LeakWarningWithPluginDisabled_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MemoryLeakWarningTest, LeakWarningWithPluginDisabled)
{
    fixture->setTestFunction(testLeakWarningWithPluginDisabled_);

    MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();

    fixture->runAllTests();

    LONGS_EQUAL(0, fixture->getFailureCount());
    fixture->assertPrintContains("Warning: Expected 1 leak(s), but leak detection was disabled");

    cpputest_free_location_with_leak_detection(leak1, __FILE__, __LINE__);
    leak1 = NULLPTR;

    MemoryLeakWarningPlugin::restoreNewDeleteOverloads();
}